

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

shared_ptr<Map_Item> __thiscall Map::GetItem(Map *this,short uid)

{
  long lVar1;
  short sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined6 in_register_00000032;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  shared_ptr<Map_Item> sVar6;
  
  plVar4 = *(long **)(CONCAT62(in_register_00000032,uid) + 0x68);
  plVar3 = (long *)(CONCAT62(in_register_00000032,uid) + 0x68);
  bVar5 = plVar4 == plVar3;
  if (!bVar5) {
    sVar2 = (short)in_RDX._M_pi;
    do {
      this->world = (World *)plVar4[2];
      lVar1 = plVar4[3];
      this->id = (short)lVar1;
      this->rid[0] = (char)((ulong)lVar1 >> 0x10);
      this->rid[1] = (char)((ulong)lVar1 >> 0x18);
      this->rid[2] = (char)((ulong)lVar1 >> 0x20);
      this->rid[3] = (char)((ulong)lVar1 >> 0x28);
      this->pk = (bool)(char)((ulong)lVar1 >> 0x30);
      this->field_0xf = (char)((ulong)lVar1 >> 0x38);
      if (lVar1 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        }
      }
      if ((short)this->world->last_character_id == sVar2) {
        if (!bVar5) goto LAB_00167e04;
        break;
      }
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->id !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->id);
        in_RDX._M_pi = extraout_RDX;
      }
      plVar4 = (long *)*plVar4;
      bVar5 = plVar4 == plVar3;
    } while (!bVar5);
  }
  this->world = (World *)0x0;
  this->id = 0;
  this->rid[0] = '\0';
  this->rid[1] = '\0';
  this->rid[2] = '\0';
  this->rid[3] = '\0';
  this->pk = false;
  this->field_0xf = 0;
LAB_00167e04:
  sVar6.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar6.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Map_Item>)sVar6.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Map_Item> Map::GetItem(short uid)
{
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == uid)
		{
			return item;
		}
	}

	return std::shared_ptr<Map_Item>();
}